

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

Ref __thiscall trun::TestRunner::GetOrAddModule(TestRunner *this,string *moduleName)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ref RVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
  local_88;
  string local_58;
  _Self local_30;
  iterator it;
  string *moduleName_local;
  TestRunner *this_local;
  Ref *tModule;
  
  it._M_node._7_1_ = 0;
  std::shared_ptr<trun::TestModule>::shared_ptr((shared_ptr<trun::TestModule> *)this,(nullptr_t)0x0)
  ;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
               *)((long)&moduleName->field_2 + 8),in_RDX);
  local_58.field_2._M_allocated_capacity =
       (size_type)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>_>
              *)((long)&moduleName->field_2 + 8));
  bVar1 = std::operator==(&local_30,(_Self *)&local_58.field_2._M_allocated_capacity);
  if (bVar1) {
    TestModule::Create(&local_58);
    std::shared_ptr<trun::TestModule>::operator=
              ((shared_ptr<trun::TestModule> *)this,(shared_ptr<trun::TestModule> *)&local_58);
    std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)&local_58);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
    ::pair<std::shared_ptr<trun::TestModule>_&,_true>
              (&local_88,in_RDX,(shared_ptr<trun::TestModule> *)this);
    std::
    map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>
    ::insert<std::pair<std::__cxx11::string,std::shared_ptr<trun::TestModule>>>
              ((map<std::__cxx11::string,std::shared_ptr<trun::TestModule>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<trun::TestModule>>>>
                *)((moduleName->field_2)._M_local_buf + 8),&local_88);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>
    ::~pair(&local_88);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<trun::TestModule>_>_>
             ::operator->(&local_30);
    std::shared_ptr<trun::TestModule>::operator=
              ((shared_ptr<trun::TestModule> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX_00;
  }
  RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref)RVar4.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestModule::Ref TestRunner::GetOrAddModule(const std::string &moduleName) {
    TestModule::Ref tModule = nullptr;

    auto it = testModules.find(moduleName);
    if (it == testModules.end()) {
        tModule = TestModule::Create(moduleName);
        // Note: Don't filter modules here - as we use this list during 'dry-run'..
        testModules.insert(std::pair<std::string, TestModule::Ref>(moduleName, tModule));
    } else {
        tModule = it->second;
    }
    return tModule;
}